

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginTabBarEx(ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags)

{
  float fVar1;
  ImVec2 IVar2;
  bool bVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  ImGuiTabBar *pIVar6;
  ImGuiPtrOrIndex *pIVar7;
  ImGuiContext *pIVar8;
  uint uVar9;
  ImU32 col;
  ImGuiPtrOrIndex *__dest;
  int iVar10;
  int iVar11;
  ImGuiTabBar *pIVar12;
  size_t __nmemb;
  int iVar13;
  float fVar14;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar8 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  bVar3 = pIVar5->SkipItems;
  if (bVar3 == false) {
    if (((uint)flags >> 0x14 & 1) == 0) {
      PushOverrideID(tab_bar->ID);
    }
    pIVar6 = (GImGui->TabBars).Buf.Data;
    iVar11 = -1;
    pIVar12 = tab_bar;
    if ((pIVar6 <= tab_bar) && (tab_bar < pIVar6 + (GImGui->TabBars).Buf.Size)) {
      iVar11 = (int)((ulong)((long)tab_bar - (long)pIVar6) >> 3) * 0x286bca1b;
      pIVar12 = (ImGuiTabBar *)0x0;
    }
    iVar13 = (pIVar8->CurrentTabBarStack).Size;
    iVar4 = (pIVar8->CurrentTabBarStack).Capacity;
    if (iVar13 == iVar4) {
      iVar13 = iVar13 + 1;
      if (iVar4 == 0) {
        iVar10 = 8;
      }
      else {
        iVar10 = iVar4 / 2 + iVar4;
      }
      if (iVar13 < iVar10) {
        iVar13 = iVar10;
      }
      if (iVar4 < iVar13) {
        __dest = (ImGuiPtrOrIndex *)MemAlloc((long)iVar13 << 4);
        pIVar7 = (pIVar8->CurrentTabBarStack).Data;
        if (pIVar7 != (ImGuiPtrOrIndex *)0x0) {
          memcpy(__dest,pIVar7,(long)(pIVar8->CurrentTabBarStack).Size << 4);
          MemFree((pIVar8->CurrentTabBarStack).Data);
        }
        (pIVar8->CurrentTabBarStack).Data = __dest;
        (pIVar8->CurrentTabBarStack).Capacity = iVar13;
      }
    }
    pIVar7 = (pIVar8->CurrentTabBarStack).Data;
    iVar13 = (pIVar8->CurrentTabBarStack).Size;
    pIVar7[iVar13].Ptr = pIVar12;
    pIVar7[iVar13].Index = iVar11;
    (pIVar8->CurrentTabBarStack).Size = (pIVar8->CurrentTabBarStack).Size + 1;
    pIVar8->CurrentTabBar = tab_bar;
    tab_bar->BackupCursorPos = (pIVar5->DC).CursorPos;
    if (tab_bar->CurrFrameVisible == pIVar8->FrameCount) {
      fVar14 = (tab_bar->BarRect).Max.y;
      fVar1 = tab_bar->ItemSpacingY;
      (pIVar5->DC).CursorPos.x = (tab_bar->BarRect).Min.x;
      (pIVar5->DC).CursorPos.y = fVar14 + fVar1;
      tab_bar->BeginCount = tab_bar->BeginCount + '\x01';
    }
    else {
      if ((((flags & 1U) != (tab_bar->Flags & 1U)) ||
          (((flags & 1U) == 0 && (tab_bar->TabsAddedNew != false)))) &&
         (__nmemb = (size_t)(tab_bar->Tabs).Size, 1 < __nmemb)) {
        qsort((tab_bar->Tabs).Data,__nmemb,0x2c,TabItemComparerByBeginOrder);
      }
      uVar9 = flags | 0x40;
      if ((flags & 0xc0U) != 0) {
        uVar9 = flags;
      }
      tab_bar->TabsAddedNew = false;
      tab_bar->Flags = uVar9;
      IVar2 = tab_bar_bb->Max;
      (tab_bar->BarRect).Min = tab_bar_bb->Min;
      (tab_bar->BarRect).Max = IVar2;
      tab_bar->WantLayout = true;
      tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
      tab_bar->CurrFrameVisible = pIVar8->FrameCount;
      tab_bar->PrevTabsContentsHeight = tab_bar->CurrTabsContentsHeight;
      tab_bar->CurrTabsContentsHeight = 0.0;
      fVar14 = (pIVar8->Style).ItemSpacing.y;
      tab_bar->ItemSpacingY = fVar14;
      tab_bar->FramePadding = (pIVar8->Style).FramePadding;
      tab_bar->TabsActiveCount = 0;
      tab_bar->BeginCount = '\x01';
      fVar1 = (tab_bar->BarRect).Max.y;
      (pIVar5->DC).CursorPos.x = (tab_bar->BarRect).Min.x;
      (pIVar5->DC).CursorPos.y = fVar14 + fVar1;
      col = GetColorU32((uint)((uVar9 >> 0x15 & 1) == 0) * 2 + 0x23,1.0);
      fVar14 = (float)(int)((pIVar5->WindowPadding).x * 0.5);
      local_38.x = (tab_bar->BarRect).Min.x - fVar14;
      IVar2 = (tab_bar->BarRect).Max;
      local_38.y = IVar2.y + -1.0;
      local_40.y = local_38.y;
      local_40.x = fVar14 + IVar2.x;
      ImDrawList::AddLine(pIVar5->DrawList,&local_38,&local_40,col,1.0);
    }
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        PushOverrideID(tab_bar->ID);

    // Add to stack
    g.CurrentTabBarStack.push_back(GetTabBarRefFromTabBar(tab_bar));
    g.CurrentTabBar = tab_bar;

    // Append with multiple BeginTabBar()/EndTabBar() pairs.
    tab_bar->BackupCursorPos = window->DC.CursorPos;
    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);
        tab_bar->BeginCount++;
        return true;
    }

    // Ensure correct ordering when toggling ImGuiTabBarFlags_Reorderable flag, or when a new tab was added while being not reorderable
    if ((flags & ImGuiTabBarFlags_Reorderable) != (tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (tab_bar->TabsAddedNew && !(flags & ImGuiTabBarFlags_Reorderable)))
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByBeginOrder);
    tab_bar->TabsAddedNew = false;

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;
    tab_bar->PrevTabsContentsHeight = tab_bar->CurrTabsContentsHeight;
    tab_bar->CurrTabsContentsHeight = 0.0f;
    tab_bar->ItemSpacingY = g.Style.ItemSpacing.y;
    tab_bar->FramePadding = g.Style.FramePadding;
    tab_bar->TabsActiveCount = 0;
    tab_bar->BeginCount = 1;

    // Set cursor pos in a way which only be used in the off-chance the user erroneously submits item before BeginTabItem(): items will overlap
    window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - IM_FLOOR(window->WindowPadding.x * 0.5f);
        const float separator_max_x = tab_bar->BarRect.Max.x + IM_FLOOR(window->WindowPadding.x * 0.5f);
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}